

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::setSortingEnabled(QTreeView *this,bool enable)

{
  QTreeViewPrivate *pQVar1;
  byte in_SIL;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  Function in_stack_00000020;
  QTreeViewPrivate *d;
  undefined8 in_stack_ffffffffffffff98;
  code *other;
  QTreeView *in_stack_ffffffffffffffa0;
  Connection *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 show;
  QHeaderView *in_stack_ffffffffffffffc0;
  ConnectionType in_stack_fffffffffffffff4;
  Object *receiverPrivate;
  
  show = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  receiverPrivate = *(Object **)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QTreeView *)0x8ef433);
  header(in_stack_ffffffffffffffa0);
  QHeaderView::setSortIndicatorShown(in_stack_ffffffffffffffc0,(bool)show);
  header(in_stack_ffffffffffffffa0);
  QHeaderView::setSectionsClickable
            ((QHeaderView *)in_stack_ffffffffffffffa0,
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  if ((bool)(in_SIL & 1) == false) {
    QObject::disconnect(&pQVar1->sortHeaderConnection);
  }
  else {
    header(in_stack_ffffffffffffffa0);
    QHeaderView::sortIndicatorSection((QHeaderView *)in_stack_ffffffffffffffa0);
    header(in_stack_ffffffffffffffa0);
    QHeaderView::sortIndicatorOrder((QHeaderView *)in_stack_ffffffffffffffa0);
    sortByColumn(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 (SortOrder)in_stack_ffffffffffffff98);
    header(in_stack_ffffffffffffffa0);
    other = QTreeViewPrivate::sortIndicatorChanged;
    this_00 = (Connection *)0x0;
    QObjectPrivate::
    connect<void(QHeaderView::*)(int,Qt::SortOrder),void(QTreeViewPrivate::*)(int,Qt::SortOrder)>
              (unaff_retaddr,(offset_in_QHeaderView_to_subr)d,receiverPrivate,in_stack_00000020,
               in_stack_fffffffffffffff4);
    QMetaObject::Connection::operator=(this_00,(Connection *)other);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  }
  pQVar1->sortingEnabled = (bool)(in_SIL & 1);
  if (*(Object **)(in_FS_OFFSET + 0x28) == receiverPrivate) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setSortingEnabled(bool enable)
{
    Q_D(QTreeView);
    header()->setSortIndicatorShown(enable);
    header()->setSectionsClickable(enable);
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
        d->sortHeaderConnection =
            QObjectPrivate::connect(header(), &QHeaderView::sortIndicatorChanged,
                                    d, &QTreeViewPrivate::sortIndicatorChanged,
                                    Qt::UniqueConnection);
    } else {
        QObject::disconnect(d->sortHeaderConnection);
    }
    d->sortingEnabled = enable;
}